

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O2

void * __thiscall
cookmem::CachedArena<cookmem::MallocArena>::getSegment
          (CachedArena<cookmem::MallocArena> *this,size_t *size)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  
  iVar1 = PtrAVLTree::remove(&this->m_tree,(char *)size);
  if ((void *)CONCAT44(extraout_var,iVar1) != (void *)0x0) {
    return (void *)CONCAT44(extraout_var,iVar1);
  }
  pvVar2 = MallocArena::getSegment(this->m_arena,size);
  return pvVar2;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        void* seg = m_tree.remove(size);
        if (seg)
        {
            return seg;
        }
        return m_arena.getSegment(size);
    }